

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseCFG.h
# Opt level: O2

CFG * __thiscall
covenant::parse_cfg<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
          (CFG *__return_storage_ptr__,covenant *this,StrParse *input,
          shared_ptr<covenant::TerminalFactory> *tfac)

{
  string *this_00;
  allocator local_89;
  TermFactory local_88;
  string local_78 [32];
  NonTerminalMap mapping;
  
  local_88.px = *(element_type **)input;
  local_88.pn.pi_ = (sp_counted_base *)(input->str)._M_dataplus._M_p;
  if (local_88.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_88.pn.pi_)->use_count_ = (local_88.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  CFG::CFG(__return_storage_ptr__,&local_88);
  boost::detail::shared_count::~shared_count(&local_88.pn);
  boost::unordered::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>_>
  ::unordered_map(&mapping);
  parse_rules<covenant::StrParse>((StrParse *)this,__return_storage_ptr__,&mapping);
  if ((ulong)*(uint *)this < *(ulong *)(this + 0x10)) {
    consume_blanks<covenant::StrParse>((StrParse *)this);
    if (((ulong)*(uint *)this < *(ulong *)(this + 0x10)) &&
       (*(char *)(*(long *)(this + 8) + (ulong)*(uint *)this) != ')')) {
      this_00 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(local_78,"during the parsing of the cfg",&local_89);
      std::__cxx11::string::string(this_00,local_78);
      __cxa_throw(this_00,&error::typeinfo,error::~error);
    }
  }
  boost::unordered::detail::
  table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~table(&mapping.table_);
  return __return_storage_ptr__;
}

Assistant:

CFG parse_cfg(In& input, TerminalFactory tfac)
{
  CFG g(tfac);

  NonTerminalMap mapping;
  parse_rules(input, g, mapping);
  if(input.empty()) return g;
  consume_blanks(input);
  // the special case if input.peek() == ')' is in case we read the
  // format (elem (##VARS##) (##CFL##))
  if (input.empty() || input.peek() == ')') 
    return g;
  
  throw error("during the parsing of the cfg");
}